

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMove8<(moira::Instr)71,(moira::Mode)5,(moira::Size)2>(Moira *this,u16 opcode)

{
  ushort uVar1;
  PrefetchQueue PVar2;
  u32 uVar3;
  uint addr;
  bool bVar4;
  bool bVar5;
  AEStackFrame frame;
  bool error;
  bool local_29;
  
  uVar3 = computeEA<(moira::Mode)5,(moira::Size)2,0ul>(this,opcode & 7);
  uVar3 = readM<(moira::MemSpace)1,(moira::Size)2,128ul>(this,uVar3,&local_29);
  if (local_29 == false) {
    bVar4 = (bool)((byte)(uVar3 >> 0xf) & 1);
    (this->reg).sr.n = bVar4;
    bVar5 = (short)uVar3 == 0;
    (this->reg).sr.z = bVar5;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    PVar2 = this->queue;
    readExt(this);
    uVar1 = (this->queue).irc;
    addr = (int)PVar2 << 0x10 | (uint)uVar1;
    if ((uVar1 & 1) == 0) {
      (this->reg).sr.n = bVar4;
      (this->reg).sr.z = bVar5;
      (this->reg).sr.v = false;
      (this->reg).sr.c = false;
      writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,addr,uVar3);
      readExt(this);
      uVar3 = (this->reg).pc;
      (this->reg).pc0 = uVar3;
      (this->queue).ird = (this->queue).irc;
      uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
      (this->queue).irc = (u16)uVar3;
    }
    else {
      frame = makeFrame<40ul>(this,addr);
      execAddressError(this,frame,0);
    }
  }
  return;
}

Assistant:

void
Moira::execMove8(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    /* Source: http://pasti.fxatari.com/68kdocs/68kPrefetch.html
     *
     * "When the destination addressing mode is long absolute and the source
     *  operand is any memory addr.mode, step 4 is interleaved in the middle of
     *  step 3. Step 3 only performs a single prefetch in this case. The other
     *  prefetch cycle that is normally performed at that step is deferred
     *  after the write cycles. So, two prefetch cycles are performed after the
     *  write ones. It is a class 2 instruction. Note: The behavior is the same
     *  disregarding transfer size (byte, word or long). But if the source
     *  operand is a data or address register, or immediate, then the behavior
     *  is the same as other MOVE variants (class 1 instruction)."
     */
    if (isMemMode(M)) {
        
        if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;
        
        reg.sr.n = NBIT<Word>(data);
        reg.sr.z = ZERO<Word>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;

        u32 ea2 = queue.irc << 16;
        readExt();
        ea2 |= queue.irc;

        if (misaligned<S>(ea2)) {
            execAddressError(makeFrame<AE_WRITE|AE_DATA>(ea2));
            return;
        }

        reg.sr.n = NBIT<S>(data);
        reg.sr.z = ZERO<S>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;

        writeM <MODE_AL,S> (ea2, data);
        readExt();
        
    } else {

        if (!readOp <M,S> (src, ea, data)) return;

        reg.sr.n = NBIT<S>(data);
        reg.sr.z = ZERO<S>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;

        if (!writeOp <MODE_AL,S> (dst, data)) return;
    }

    prefetch<POLLIPL>();
}